

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

aiLight * __thiscall
Assimp::BlenderImporter::ConvertLight
          (BlenderImporter *this,Scene *param_1,Object *obj,Lamp *lamp,ConversionData *param_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Head_base<0UL,_aiLight_*,_false> this_00;
  pointer __p;
  float fVar5;
  float fVar6;
  float fVar7;
  unique_ptr<aiLight,_std::default_delete<aiLight>_> out;
  __uniq_ptr_impl<aiLight,_std::default_delete<aiLight>_> local_20;
  
  this_00._M_head_impl = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00._M_head_impl);
  local_20._M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight>_>.
  super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
       (tuple<aiLight_*,_std::default_delete<aiLight>_>)
       (tuple<aiLight_*,_std::default_delete<aiLight>_>)this_00._M_head_impl;
  aiString::Set((aiString *)this_00._M_head_impl,(obj->id).name + 2);
  switch(lamp->type) {
  case Type_Local:
    (this_00._M_head_impl)->mType = aiLightSource_POINT;
    break;
  case Type_Sun:
    (this_00._M_head_impl)->mType = aiLightSource_DIRECTIONAL;
    goto LAB_00472be2;
  case Type_Spot:
    (this_00._M_head_impl)->mType = aiLightSource_SPOT;
    ((this_00._M_head_impl)->mDirection).x = 0.0;
    ((this_00._M_head_impl)->mDirection).y = 0.0;
    *(undefined8 *)&((this_00._M_head_impl)->mDirection).z = 0xbf800000;
    ((this_00._M_head_impl)->mUp).y = 1.0;
    ((this_00._M_head_impl)->mUp).z = 0.0;
    fVar6 = lamp->spotsize;
    (this_00._M_head_impl)->mAngleInnerCone = (1.0 - lamp->spotblend) * fVar6;
    (this_00._M_head_impl)->mAngleOuterCone = fVar6;
    break;
  case Type_Area:
    (this_00._M_head_impl)->mType = aiLightSource_AREA;
    fVar6 = lamp->area_size;
    if (lamp->area_shape != 0) {
      fVar6 = lamp->area_sizey;
    }
    ((this_00._M_head_impl)->mSize).x = lamp->area_size;
    ((this_00._M_head_impl)->mSize).y = fVar6;
LAB_00472be2:
    ((this_00._M_head_impl)->mDirection).x = 0.0;
    ((this_00._M_head_impl)->mDirection).y = 0.0;
    *(undefined8 *)&((this_00._M_head_impl)->mDirection).z = 0xbf800000;
    ((this_00._M_head_impl)->mUp).y = 1.0;
    ((this_00._M_head_impl)->mUp).z = 0.0;
  }
  fVar6 = lamp->energy;
  fVar7 = lamp->b * fVar6;
  ((this_00._M_head_impl)->mColorAmbient).b = fVar7;
  ((this_00._M_head_impl)->mColorSpecular).b = fVar7;
  uVar1 = lamp->r;
  uVar3 = lamp->g;
  fVar5 = fVar6 * (float)uVar1;
  fVar6 = fVar6 * (float)uVar3;
  ((this_00._M_head_impl)->mColorAmbient).r = fVar5;
  ((this_00._M_head_impl)->mColorAmbient).g = fVar6;
  ((this_00._M_head_impl)->mColorSpecular).r = fVar5;
  ((this_00._M_head_impl)->mColorSpecular).g = fVar6;
  ((this_00._M_head_impl)->mColorDiffuse).r = fVar5;
  ((this_00._M_head_impl)->mColorDiffuse).g = fVar6;
  ((this_00._M_head_impl)->mColorDiffuse).b = fVar7;
  uVar2 = lamp->constant_coefficient;
  uVar4 = lamp->linear_coefficient;
  if (((((float)uVar2 != 1.0) || (NAN((float)uVar2))) || ((float)uVar4 != 0.0)) ||
     (((NAN((float)uVar4) || (lamp->quadratic_coefficient != 0.0)) ||
      ((NAN(lamp->quadratic_coefficient) || (fVar6 = lamp->dist, fVar6 <= 0.0)))))) {
    (this_00._M_head_impl)->mAttenuationConstant = (float)uVar2;
    (this_00._M_head_impl)->mAttenuationLinear = (float)uVar4;
    fVar6 = lamp->quadratic_coefficient;
  }
  else {
    (this_00._M_head_impl)->mAttenuationConstant = 1.0;
    (this_00._M_head_impl)->mAttenuationLinear = 2.0 / fVar6;
    fVar6 = 1.0 / (fVar6 * fVar6);
  }
  (this_00._M_head_impl)->mAttenuationQuadratic = fVar6;
  local_20._M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight>_>.
  super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
       (tuple<aiLight_*,_std::default_delete<aiLight>_>)
       (_Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight>_>)0x0;
  std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::~unique_ptr
            ((unique_ptr<aiLight,_std::default_delete<aiLight>_> *)&local_20);
  return (_Head_base<0UL,_aiLight_*,_false>)this_00._M_head_impl;
}

Assistant:

aiLight* BlenderImporter::ConvertLight(const Scene& /*in*/, const Object* obj, const Lamp* lamp, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiLight> out(new aiLight());
    out->mName = obj->id.name+2;

    switch (lamp->type)
    {
        case Lamp::Type_Local:
            out->mType = aiLightSource_POINT;
            break;
        case Lamp::Type_Spot:
            out->mType = aiLightSource_SPOT;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);

            out->mAngleInnerCone = lamp->spotsize * (1.0f - lamp->spotblend);
            out->mAngleOuterCone = lamp->spotsize;
            break;
        case Lamp::Type_Sun:
            out->mType = aiLightSource_DIRECTIONAL;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        case Lamp::Type_Area:
            out->mType = aiLightSource_AREA;

            if (lamp->area_shape == 0) {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_size);
            }
            else {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_sizey);
            }

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        default:
            break;
    }

    out->mColorAmbient = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorSpecular = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorDiffuse = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;

    // If default values are supplied, compute the coefficients from light's max distance
    // Read this: https://imdoingitwrong.wordpress.com/2011/01/31/light-attenuation/
    //
    if (lamp->constant_coefficient == 1.0f && lamp->linear_coefficient == 0.0f && lamp->quadratic_coefficient == 0.0f && lamp->dist > 0.0f)
    {
        out->mAttenuationConstant = 1.0f;
        out->mAttenuationLinear = 2.0f / lamp->dist;
        out->mAttenuationQuadratic = 1.0f / (lamp->dist * lamp->dist);
    }
    else
    {
        out->mAttenuationConstant = lamp->constant_coefficient;
        out->mAttenuationLinear = lamp->linear_coefficient;
        out->mAttenuationQuadratic = lamp->quadratic_coefficient;
    }

    return out.release();
}